

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

void mi_commit_mask_create(size_t bitidx,size_t bitcount,mi_commit_mask_t *cm)

{
  ulong uVar1;
  ulong uVar2;
  size_t *psVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  if (bitcount == 0) {
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
  }
  else {
    if (bitcount != 0x200) {
      cm->mask[6] = 0;
      cm->mask[7] = 0;
      cm->mask[4] = 0;
      cm->mask[5] = 0;
      cm->mask[2] = 0;
      cm->mask[3] = 0;
      cm->mask[0] = 0;
      cm->mask[1] = 0;
      uVar1 = (ulong)((uint)bitidx & 0x3f);
      psVar3 = cm->mask + (bitidx >> 6);
      do {
        uVar2 = 0x40 - uVar1;
        if (bitcount < 0x40 - uVar1) {
          uVar2 = bitcount;
        }
        sVar4 = ~(-1L << ((byte)uVar2 & 0x3f)) << (sbyte)uVar1;
        if (0x3f < uVar2) {
          sVar4 = 0xffffffffffffffff;
        }
        *psVar3 = sVar4;
        psVar3 = psVar3 + 1;
        uVar1 = 0;
        bitcount = bitcount - uVar2;
      } while (bitcount != 0);
      return;
    }
    uVar8 = 0xffffffff;
    uVar5 = 0xffffffff;
    uVar6 = 0xffffffff;
    uVar7 = 0xffffffff;
  }
  *(undefined4 *)(cm->mask + 6) = uVar5;
  *(undefined4 *)((long)cm->mask + 0x34) = uVar6;
  *(undefined4 *)(cm->mask + 7) = uVar7;
  *(undefined4 *)((long)cm->mask + 0x3c) = uVar8;
  *(undefined4 *)(cm->mask + 4) = uVar5;
  *(undefined4 *)((long)cm->mask + 0x24) = uVar6;
  *(undefined4 *)(cm->mask + 5) = uVar7;
  *(undefined4 *)((long)cm->mask + 0x2c) = uVar8;
  *(undefined4 *)(cm->mask + 2) = uVar5;
  *(undefined4 *)((long)cm->mask + 0x14) = uVar6;
  *(undefined4 *)(cm->mask + 3) = uVar7;
  *(undefined4 *)((long)cm->mask + 0x1c) = uVar8;
  *(undefined4 *)cm->mask = uVar5;
  *(undefined4 *)((long)cm->mask + 4) = uVar6;
  *(undefined4 *)(cm->mask + 1) = uVar7;
  *(undefined4 *)((long)cm->mask + 0xc) = uVar8;
  return;
}

Assistant:

static void mi_commit_mask_create(size_t bitidx, size_t bitcount, mi_commit_mask_t* cm) {
  mi_assert_internal(bitidx < MI_COMMIT_MASK_BITS);
  mi_assert_internal((bitidx + bitcount) <= MI_COMMIT_MASK_BITS);
  if (bitcount == MI_COMMIT_MASK_BITS) {
    mi_assert_internal(bitidx==0);
    mi_commit_mask_create_full(cm);
  }
  else if (bitcount == 0) {
    mi_commit_mask_create_empty(cm);
  }
  else {
    mi_commit_mask_create_empty(cm);
    size_t i = bitidx / MI_COMMIT_MASK_FIELD_BITS;
    size_t ofs = bitidx % MI_COMMIT_MASK_FIELD_BITS;
    while (bitcount > 0) {
      mi_assert_internal(i < MI_COMMIT_MASK_FIELD_COUNT);
      size_t avail = MI_COMMIT_MASK_FIELD_BITS - ofs;
      size_t count = (bitcount > avail ? avail : bitcount);
      size_t mask = (count >= MI_COMMIT_MASK_FIELD_BITS ? ~((size_t)0) : (((size_t)1 << count) - 1) << ofs);
      cm->mask[i] = mask;
      bitcount -= count;
      ofs = 0;
      i++;
    }
  }
}